

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astc_codec.cpp
# Opt level: O1

ktx_error_code_e ktxTexture2_CompressAstc(ktxTexture2 *This,ktx_uint32_t quality)

{
  ktx_error_code_e kVar1;
  ktx_uint32_t kVar2;
  ktx_uint32_t kVar3;
  ktxAstcParams params;
  ktxAstcParams local_28;
  
  local_28.structSize = 0x20;
  local_28.verbose = false;
  local_28._5_3_ = 0;
  local_28.threadCount = 1;
  local_28.blockDimension = 4;
  local_28.normalMap = false;
  local_28.perceptual = false;
  local_28.inputSwizzle[0] = '\0';
  local_28.inputSwizzle[1] = '\0';
  local_28.inputSwizzle[2] = '\0';
  local_28.inputSwizzle[3] = '\0';
  local_28._30_2_ = 0;
  kVar2 = 10;
  if (quality < 10) {
    kVar2 = 0;
  }
  kVar3 = 0x62;
  if (quality < 0x62) {
    kVar3 = 0x3c;
  }
  local_28.qualityLevel = 100;
  if (quality < 100) {
    local_28.qualityLevel = kVar3;
  }
  if (quality < 0x3c) {
    local_28.qualityLevel = kVar2;
  }
  local_28.mode = 1;
  kVar1 = ktxTexture2_CompressAstcEx(This,&local_28);
  return kVar1;
}

Assistant:

KTX_error_code
ktxTexture2_CompressAstc(ktxTexture2* This, ktx_uint32_t quality) {
    ktxAstcParams params = astcDefaultOptions();

    if (quality >= KTX_PACK_ASTC_QUALITY_LEVEL_FASTEST)
        params.qualityLevel = KTX_PACK_ASTC_QUALITY_LEVEL_FASTEST;

    if (quality >= KTX_PACK_ASTC_QUALITY_LEVEL_FAST)
        params.qualityLevel = KTX_PACK_ASTC_QUALITY_LEVEL_FAST;

    if (quality >= KTX_PACK_ASTC_QUALITY_LEVEL_MEDIUM)
        params.qualityLevel = KTX_PACK_ASTC_QUALITY_LEVEL_MEDIUM;

    if (quality >= KTX_PACK_ASTC_QUALITY_LEVEL_THOROUGH)
        params.qualityLevel = KTX_PACK_ASTC_QUALITY_LEVEL_THOROUGH;

    if (quality >= KTX_PACK_ASTC_QUALITY_LEVEL_EXHAUSTIVE)
        params.qualityLevel = KTX_PACK_ASTC_QUALITY_LEVEL_EXHAUSTIVE;

    return ktxTexture2_CompressAstcEx(This, &params);
}